

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::unsplice_line(CTcTokenizer *this,char *new_line_start)

{
  CTcTokString *pCVar1;
  char *pcVar2;
  size_t sVar3;
  CTcTokString *in_RSI;
  long in_RDI;
  size_t keep_len;
  
  pCVar1 = (CTcTokString *)CTcTokString::get_text((CTcTokString *)(in_RDI + 0xa0));
  if (pCVar1 <= in_RSI) {
    pcVar2 = CTcTokString::get_text((CTcTokString *)(in_RDI + 0xa0));
    sVar3 = CTcTokString::get_text_len((CTcTokString *)(in_RDI + 0xa0));
    if (in_RSI <= (CTcTokString *)(pcVar2 + sVar3)) {
      pCVar1 = in_RSI;
      pcVar2 = CTcTokString::get_text((CTcTokString *)(in_RDI + 0xa0));
      sVar3 = (long)pCVar1 - (long)pcVar2;
      pcVar2 = (char *)(in_RDI + 0xc0);
      CTcTokString::get_text_len((CTcTokString *)(in_RDI + 0xa0));
      CTcTokString::prepend(in_RSI,pcVar2,(size_t)pCVar1);
      CTcTokString::set_text_len((CTcTokString *)(in_RDI + 0xa0),sVar3);
      return;
    }
  }
  throw_internal_error(0x273d);
}

Assistant:

void CTcTokenizer::unsplice_line(const char *new_line_start)
{
    /* make sure the starting point is within the current line */
    if (!(new_line_start >= linebuf_.get_text()
          && new_line_start <= linebuf_.get_text() + linebuf_.get_text_len()))
    {
        /* note the error - this is an internal problem */
        throw_internal_error(TCERR_UNSPLICE_NOT_CUR);
        return;
    }

    /* calculate the length of the part we're keeping */
    size_t keep_len = new_line_start - linebuf_.get_text();

    /* 
     *   prepend the remainder of the current line into the unsplice buffer
     *   (we prepend it because the unsplice line is text that comes after
     *   the current line - so anything in the current line comes before
     *   anything already in the unsplice buffer) 
     */
    unsplicebuf_.prepend(new_line_start, linebuf_.get_text_len() - keep_len);

    /* cut off the current line at the given point */
    linebuf_.set_text_len(keep_len);
}